

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O2

void __thiscall QGraphicsItem::setCursor(QGraphicsItem *this,QCursor *cursor)

{
  undefined1 *puVar1;
  uint *puVar2;
  long *plVar3;
  QGraphicsItemPrivate *this_00;
  QGraphicsScene *pQVar4;
  QWidget *this_01;
  undefined8 uVar5;
  char cVar6;
  QWidget *this_02;
  long lVar7;
  long lVar8;
  long in_FS_OFFSET;
  QPointF QVar9;
  undefined1 local_f0 [16];
  char *local_e0;
  QGraphicsItem *local_d8;
  qreal local_d0;
  qreal local_c8;
  QPoint local_c0;
  anon_union_24_3_e3d07ef4_for_data local_b8;
  QVariant local_98;
  anon_union_24_3_e3d07ef4_for_data local_78;
  anon_union_24_3_e3d07ef4_for_data local_58;
  undefined1 *puStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
  puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
  local_58.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
  local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  ::QVariant::fromValue<QCursor>
            ((enable_if_t<std::is_copy_constructible_v<QCursor>_&&_std::is_destructible_v<QCursor>,_QVariant>
              *)&local_78,cursor);
  (*this->_vptr_QGraphicsItem[0x21])(&local_58,this,0x11,&local_78);
  ::QVariant::~QVariant((QVariant *)&local_78);
  this_00 = (this->d_ptr).d;
  qvariant_cast<QCursor>((QVariant *)&local_b8);
  QCursor::operator_cast_to_QVariant((QVariant *)&local_78,(QCursor *)&local_b8.shared);
  QGraphicsItemPrivate::setExtra(this_00,ExtraCursor,(QVariant *)&local_78);
  ::QVariant::~QVariant((QVariant *)&local_78);
  QCursor::~QCursor((QCursor *)&local_b8.shared);
  puVar1 = &((this->d_ptr).d)->field_0x160;
  *(ulong *)puVar1 = *(ulong *)puVar1 | 0x8000;
  pQVar4 = ((this->d_ptr).d)->scene;
  if (pQVar4 != (QGraphicsScene *)0x0) {
    puVar2 = (uint *)(*(long *)&pQVar4->field_0x8 + 0xb8);
    *puVar2 = *puVar2 & 0xffffdfff;
    local_b8._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_b8.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
    local_b8._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    QGraphicsScene::views
              ((QList<QGraphicsView_*> *)&local_b8,(QGraphicsScene *)((this->d_ptr).d)->scene);
    uVar5 = local_b8._8_8_;
    lVar7 = local_b8._16_8_ << 3;
    lVar8 = 0;
    do {
      if (lVar7 == lVar8) goto LAB_005747b3;
      this_01 = *(QWidget **)(uVar5 + lVar8);
      this_02 = QAbstractScrollArea::viewport((QAbstractScrollArea *)this_01);
      QWidget::setMouseTracking(this_02,true);
      lVar8 = lVar8 + 8;
    } while ((this_01->data->widget_attributes & 2) == 0);
    local_78.shared = (PrivateShared *)QCursor::pos();
    local_c0 = QWidget::mapFromGlobal(this_01,(QPoint *)&local_78.shared);
    QVar9 = QGraphicsView::mapToScene((QGraphicsView *)this_01,&local_c0);
    local_78._8_8_ = QVar9.yp;
    local_78.shared = (PrivateShared *)QVar9.xp;
    QVar9 = mapFromScene(this,(QPointF *)&local_78);
    local_c8 = QVar9.yp;
    local_d0 = QVar9.xp;
    (*this->_vptr_QGraphicsItem[3])(&local_78,this);
    cVar6 = QRectF::contains((QPointF *)&local_78);
    if (cVar6 != '\0') {
      local_78._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_78.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
      local_78._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      QGraphicsView::items((QList<QGraphicsItem_*> *)&local_78,(QGraphicsView *)this_01,&local_c0);
      lVar7 = 0;
      do {
        if (local_78._16_8_ << 3 == lVar7) goto LAB_005747a6;
        plVar3 = (long *)(local_78._8_8_ + lVar7);
        lVar7 = lVar7 + 8;
      } while ((*(byte *)(*(long *)(*plVar3 + 8) + 0x161) & 0x80) == 0);
      QGraphicsItem::cursor((QGraphicsItem *)local_f0);
      local_f0._8_8_ = &QtPrivate::QMetaTypeInterfaceWrapper<QCursor>::metaType;
      local_e0 = "QCursor";
      local_d8 = (QGraphicsItem *)local_f0;
      QMetaObject::invokeMethod<QMetaMethodArgument>
                (&this_01->super_QObject,"_q_setViewportCursor",
                 (QMetaMethodArgument *)(local_f0 + 8));
      QCursor::~QCursor((QCursor *)local_f0);
LAB_005747a6:
      QArrayDataPointer<QGraphicsItem_*>::~QArrayDataPointer
                ((QArrayDataPointer<QGraphicsItem_*> *)&local_78);
    }
LAB_005747b3:
    QArrayDataPointer<QGraphicsView_*>::~QArrayDataPointer
              ((QArrayDataPointer<QGraphicsView_*> *)&local_b8);
  }
  (*this->_vptr_QGraphicsItem[0x21])(&local_98,this,0x12,&local_58);
  ::QVariant::~QVariant(&local_98);
  ::QVariant::~QVariant((QVariant *)&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsItem::setCursor(const QCursor &cursor)
{
    const QVariant cursorVariant(itemChange(ItemCursorChange, QVariant::fromValue<QCursor>(cursor)));
    d_ptr->setExtra(QGraphicsItemPrivate::ExtraCursor, qvariant_cast<QCursor>(cursorVariant));
    d_ptr->hasCursor = 1;
    if (d_ptr->scene) {
        d_ptr->scene->d_func()->allItemsUseDefaultCursor = false;
        const auto views = d_ptr->scene->views();
        for (QGraphicsView *view : views) {
            view->viewport()->setMouseTracking(true);
            // Note: Some of this logic is duplicated in QGraphicsView's mouse events.
            if (view->underMouse()) {
                const QPoint viewPoint = view->mapFromGlobal(QCursor::pos());
                const QPointF cursorPos = mapFromScene(view->mapToScene(viewPoint));
                // the cursor can only change if the current item is under the mouse
                if (boundingRect().contains(cursorPos)) {
                    const auto itemsUnderCursor = view->items(viewPoint);
                    for (QGraphicsItem *itemUnderCursor : itemsUnderCursor) {
                        if (itemUnderCursor->hasCursor()) {
                            QMetaObject::invokeMethod(view, "_q_setViewportCursor",
                                                      Q_ARG(QCursor, itemUnderCursor->cursor()));
                            break;
                        }
                    }
                }
                break;
            }
        }
    }
    itemChange(ItemCursorHasChanged, cursorVariant);
}